

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

uint32_t gravity_fiber_size(gravity_vm *vm,gravity_fiber_t *fiber)

{
  uint32_t uVar1;
  uint32_t uVar2;
  gravity_value_t *pgVar3;
  int iVar4;
  
  (fiber->gc).visited = true;
  iVar4 = fiber->stackalloc * 0x10 + fiber->framesalloc * 0x30 + 0xa8;
  for (pgVar3 = fiber->stack; pgVar3 < fiber->stacktop; pgVar3 = pgVar3 + 1) {
    uVar1 = gravity_value_size(vm,*pgVar3);
    iVar4 = iVar4 + uVar1;
  }
  uVar1 = string_size(fiber->error);
  uVar2 = gravity_object_size(vm,(gravity_object_t *)fiber->caller);
  (fiber->gc).visited = false;
  return uVar2 + uVar1 + iVar4;
}

Assistant:

uint32_t gravity_fiber_size (gravity_vm *vm, gravity_fiber_t *fiber) {
    SET_OBJECT_VISITED_FLAG(fiber, true);
    
    // internal size
    uint32_t fiber_size = sizeof(gravity_fiber_t);
    fiber_size += fiber->stackalloc * sizeof(gravity_value_t);
    fiber_size += fiber->framesalloc * sizeof(gravity_callframe_t);

    // stack size
    for (gravity_value_t* slot = fiber->stack; slot < fiber->stacktop; ++slot) {
        fiber_size += gravity_value_size(vm, *slot);
    }

    fiber_size += string_size(fiber->error);
    fiber_size += gravity_object_size(vm, (gravity_object_t *)fiber->caller);

    SET_OBJECT_VISITED_FLAG(fiber, false);
    return fiber_size;
}